

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

char16_t * __thiscall QtPrivate::qustrcasechr(QtPrivate *this,QStringView str,char16_t c)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  QtPrivate *__it;
  QtPrivate *__it_00;
  storage_type_conflict *psVar4;
  QtPrivate *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined2 local_3a;
  long local_38;
  
  uVar3 = str.m_size;
  psVar4 = str.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)(int)(short)*(ushort *)
                             (QUnicodeTables::uc_properties +
                             (ulong)*(ushort *)
                                     (QUnicodeTables::uc_property_trie +
                                     (ulong)(((uint)str.m_size & 0x1f) +
                                            (uint)*(ushort *)
                                                   (QUnicodeTables::uc_property_trie +
                                                   (uVar3 >> 5 & 0x7ffffff) * 2)) * 2) * 0x14 + 0xe)
          >> 1;
  if ((*(ushort *)
        (QUnicodeTables::uc_properties +
        (ulong)*(ushort *)
                (QUnicodeTables::uc_property_trie +
                (ulong)(((uint)str.m_size & 0x1f) +
                       (uint)*(ushort *)
                              (QUnicodeTables::uc_property_trie + (uVar3 >> 5 & 0x7ffffff) * 2)) * 2
                ) * 0x14 + 0xe) & 1) == 0) {
    uVar3 = (ulong)(uVar2 + (uint)str.m_size);
  }
  else {
    lVar6 = (long)(short)uVar2;
    if (*(short *)(QUnicodeTables::specialCaseMap + lVar6 * 2) == 1) {
      uVar3 = (ulong)*(ushort *)(QUnicodeTables::specialCaseMap + lVar6 * 2 + 2);
    }
  }
  local_3a = (undefined2)uVar3;
  __it = this;
  if (0 < (long)psVar4 >> 2) {
    __it = this + ((ulong)psVar4 & 0xfffffffffffffffc) * 2;
    lVar6 = ((long)psVar4 >> 2) + 1;
    __it_00 = this;
    do {
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)__it_00);
      pQVar5 = __it_00;
      if (bVar1) goto LAB_0011ebd6;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)(__it_00 + 2));
      pQVar5 = __it_00 + 2;
      if (bVar1) goto LAB_0011ebd6;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)(__it_00 + 4));
      pQVar5 = __it_00 + 4;
      if (bVar1) goto LAB_0011ebd6;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)(__it_00 + 6));
      pQVar5 = __it_00 + 6;
      if (bVar1) goto LAB_0011ebd6;
      __it_00 = __it_00 + 8;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)(this + (long)psVar4 * 2) - (long)__it >> 1;
  if (lVar6 == 1) {
LAB_0011ebbf:
    bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)__it);
    pQVar5 = __it;
    if (bVar1) goto LAB_0011ebd6;
  }
  else {
    if (lVar6 == 2) {
LAB_0011eba0:
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)__it);
      pQVar5 = __it;
      if (bVar1) goto LAB_0011ebd6;
      __it = __it + 2;
      goto LAB_0011ebbf;
    }
    if (lVar6 == 3) {
      bVar1 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)__it);
      pQVar5 = __it;
      if (bVar1) goto LAB_0011ebd6;
      __it = __it + 2;
      goto LAB_0011eba0;
    }
  }
  pQVar5 = this + (long)psVar4 * 2;
LAB_0011ebd6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (char16_t *)pQVar5;
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrcasechr(QStringView str, char16_t c) noexcept
{
    const QChar *n = str.begin();
    const QChar *e = str.end();
    c = foldCase(c);
    auto it = std::find_if(n, e, [c](auto ch) { return foldAndCompare(ch, QChar(c)); });
    return reinterpret_cast<const char16_t *>(it);
}